

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> * __thiscall
testing::internal::MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::operator=
          (MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *this,
          MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *other)

{
  MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *other_local;
  MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }